

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int lhCursorKeyLength(unqlite_kv_cursor *pCursor,int *pLen)

{
  int iVar1;
  
  iVar1 = -9;
  if ((*(int *)&pCursor[1].pStore == 2) && (pCursor[2].pStore != (unqlite_kv_engine *)0x0)) {
    *pLen = *(int *)((long)&(pCursor[2].pStore)->pIo + 4);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int lhCursorKeyLength(unqlite_kv_cursor *pCursor,int *pLen)
{
	lhash_kv_cursor *pCur = (lhash_kv_cursor *)pCursor;
	lhcell *pCell;
	
	if( pCur->iState != L_HASH_CURSOR_STATE_CELL || pCur->pCell == 0 ){
		/* Invalid state */
		return UNQLITE_INVALID;
	}
	/* Point to the target cell */
	pCell = pCur->pCell;
	/* Return key length */
	*pLen = (int)pCell->nKey;
	return UNQLITE_OK;
}